

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn.h
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
asn1::mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>>
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,asn1 *this,
          uint8_t tag,vector<unsigned_char,_std::allocator<unsigned_char>_> *v)

{
  undefined7 in_register_00000011;
  undefined1 auStack_38 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> vec2;
  
  auStack_38 = (undefined1  [8])0x0;
  vec2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vec2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_38,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT71(in_register_00000011,tag));
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pushHead(__return_storage_ptr__,(uint8_t)this,
           (int)vec2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start - auStack_38._0_4_);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
             (const_iterator)
             (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )auStack_38,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )vec2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> mkSEQ(uint8_t tag, const V&... v)
{
    std::vector<uint8_t> vec2;
    mkSEQ(vec2, v...);

    std::vector<uint8_t> vec;
    pushHead(vec, tag, vec2.size());
    vec.insert(vec.end(), vec2.begin(), vec2.end());
    return vec;
}